

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O3

bool __thiscall SignerLocation::Decode(SignerLocation *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  size_t *cbUsed_00;
  long lVar1;
  bool bVar2;
  DecodeResult DVar3;
  size_t sVar4;
  size_t cbIn_00;
  byte bVar5;
  undefined1 auStack_58 [8];
  SequenceHelper sh;
  
  auStack_58 = (undefined1  [8])0x0;
  sh.dataSize = 0;
  sh.prefixSize = 0;
  sh.cbUsed._0_1_ = 0;
  sh.cbCurrent = (size_t)cbUsed;
  DVar3 = SequenceHelper::Init((SequenceHelper *)auStack_58,pIn,cbIn,&(this->super_DerBase).cbData);
  if (DVar3 < Success) {
    bVar5 = 6 >> ((byte)DVar3 & 7);
  }
  else {
    lVar1 = sh.dataSize + *(long *)sh.cbCurrent;
    sVar4 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
    cbUsed_00 = &sh.prefixSize;
    bVar2 = AnyType::Decode(&(this->countryName).super_ChoiceType.value,pIn + lVar1,sVar4,cbUsed_00)
    ;
    if (bVar2) {
      bVar5 = pIn[lVar1];
      (this->countryName).super_ChoiceType.derType.type = bVar5 & (BMPString|Boolean);
      (this->countryName).super_ChoiceType.derType._class = (uint)(bVar5 >> 6);
      (this->countryName).super_ChoiceType.derType.constructed = (bool)(bVar5 >> 5 & 1);
      *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
      sh.prefixSize = 0;
      lVar1 = sh.dataSize + *(long *)sh.cbCurrent;
      sVar4 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
      bVar2 = AnyType::Decode(&(this->localityName).super_ChoiceType.value,pIn + lVar1,sVar4,
                              cbUsed_00);
      sVar4 = sh.dataSize;
      if (bVar2) {
        bVar5 = pIn[lVar1];
        (this->localityName).super_ChoiceType.derType.type = bVar5 & (BMPString|Boolean);
        (this->localityName).super_ChoiceType.derType._class = (uint)(bVar5 >> 6);
        (this->localityName).super_ChoiceType.derType.constructed = (bool)(bVar5 >> 5 & 1);
        *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
        sh.prefixSize = 0;
        lVar1 = *(long *)sh.cbCurrent;
        cbIn_00 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
        bVar5 = DerBase::DecodeSet<DirectoryString>
                          (pIn + sVar4 + lVar1,cbIn_00,cbUsed_00,&this->postalAdddress);
        goto LAB_00120c91;
      }
    }
    bVar5 = 0;
  }
LAB_00120c91:
  *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
  sh.prefixSize = 0;
  SequenceHelper::CheckExit((SequenceHelper *)auStack_58);
  *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.dataSize;
  return (bool)(bVar5 & 1);
}

Assistant:

bool SignerLocation::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
    SequenceHelper sh(cbUsed);

    switch (sh.Init(pIn, cbIn, this->cbData))
    {
    case DecodeResult::Failed:
        return false;
    case DecodeResult::Null:
    case DecodeResult::EmptySequence:
        return true;
    case DecodeResult::Success:
        break;
    }
    
    if (!countryName.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!localityName.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
        return false;

    sh.Update();
    if (!DecodeSet(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize(), postalAdddress))
        return false;

    return true;
}